

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random_numerators.hpp
# Opt level: O1

uint32_t * __thiscall
random_numerators<short>::allocate(random_numerators<short> *this,uint32_t size)

{
  int iVar1;
  void *ptr;
  uint32_t *local_8;
  
  local_8 = (uint32_t *)0x0;
  iVar1 = posix_memalign(&local_8,0x40,(ulong)size);
  if (iVar1 == 0) {
    return local_8;
  }
  puts("Failed to align memory!");
  exit(1);
}

Assistant:

uint32_t *allocate(uint32_t size) {
#if defined(__AVR__)
        return (uint32_t *)malloc(size);
#elif defined(LIBDIVIDE_WINDOWS)
        /* Align memory to 64 byte boundary for AVX512 */
        return (uint32_t *)_aligned_malloc(size, 64);
#else
        /* Align memory to 64 byte boundary for AVX512 */
        void *ptr = NULL;
        int failed = posix_memalign(&ptr, 64, size);
        if (failed) {
            printf("Failed to align memory!\n");
            exit(1);
        }
        return  (uint32_t *)ptr;
#endif
    }